

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

string * Catch::clara::detail::normaliseOpt(string *optName)

{
  string *in_RSI;
  string *in_RDI;
  
  ::std::__cxx11::string::string((string *)in_RDI,in_RSI);
  return in_RDI;
}

Assistant:

inline auto normaliseOpt( std::string const &optName ) -> std::string {
#ifdef CATCH_PLATFORM_WINDOWS
        if( optName[0] == '/' )
            return "-" + optName.substr( 1 );
        else
#endif
            return optName;
    }